

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionShapeBullet.h
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionShapeBullet::ChCollisionShapeBullet
          (ChCollisionShapeBullet *this,Type type,shared_ptr<chrono::ChMaterialSurface> *material)

{
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChCollisionShape::ChCollisionShape
            (&this->super_ChCollisionShape,type,(shared_ptr<chrono::ChMaterialSurface> *)&_Stack_28)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  (this->super_ChCollisionShape)._vptr_ChCollisionShape =
       (_func_int **)&PTR__ChCollisionShapeBullet_01188070;
  this->m_bt_shape = (cbtCollisionShape *)0x0;
  return;
}

Assistant:

ChCollisionShapeBullet(Type type, std::shared_ptr<ChMaterialSurface> material)
        : ChCollisionShape(type, material), m_bt_shape(nullptr) {}